

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setReference(SignalPtr<double,_int> *this,double *t,Mutex *m)

{
  _func_int *p_Var1;
  
  (*this->_vptr_SignalPtr[2])
            (this,(_func_int *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  p_Var1 = this->_vptr_SignalPtr[-3];
  *(undefined4 *)(&this->field_0x30 + (long)p_Var1) = 1;
  *(double **)(&this->field_0x58 + (long)p_Var1) = t;
  *(Mutex **)(&this->field_0x90 + (long)p_Var1) = m;
  (&this->field_0x50)[(long)p_Var1] = 0;
  (&this->field_0x2c)[(long)p_Var1] = 1;
  return;
}

Assistant:

virtual void setReference(const T *t,
                            typename Signal<T, Time>::Mutex *m = NULL) {
    plug(this);
    Signal<T, Time>::setReference(t, m);
  }